

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

LoadStatus __thiscall BuildLog::Load(BuildLog *this,string *path,string *err)

{
  char cVar1;
  Metrics *this_00;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  undefined1 *puVar5;
  longlong lVar6;
  void *pvVar7;
  iterator iVar8;
  string *psVar9;
  ulonglong uVar10;
  uint64_t uVar11;
  int *piVar12;
  Metric *pMVar13;
  size_t extraout_RDX;
  size_t sVar14;
  LoadStatus LVar15;
  LogEntry *this_01;
  char *pcVar16;
  char *__nptr;
  StringPiece command;
  pair<std::__detail::_Node_iterator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_false,_true>,_bool>
  pVar17;
  int log_version;
  uint uStack_400ec;
  char *line_end;
  ulong uStack_400e0;
  __hashtable *__h;
  char *line_start;
  int iStack_400c8;
  int iStack_400c4;
  FILE *pFStack_400c0;
  string *psStack_400b8;
  longlong lStack_400b0;
  string *psStack_400a8;
  string *psStack_400a0;
  key_type kStack_40098;
  string *psStack_40088;
  string output;
  ScopedMetric metrics_h_scoped;
  LineReader reader;
  
  if ((Load(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar3 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar13 = (Metric *)0x0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&reader,".ninja_log load",(allocator<char> *)&output);
      pMVar13 = Metrics::NewMetric(this_00,(string *)&reader);
      std::__cxx11::string::~string((string *)&reader);
    }
    Load::metrics_h_metric = pMVar13;
    __cxa_guard_release(&Load(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Load::metrics_h_metric);
  pFVar4 = fopen((path->_M_dataplus)._M_p,"r");
  if (pFVar4 == (FILE *)0x0) {
    piVar12 = __errno_location();
    if (*piVar12 == 2) {
      LVar15 = LOAD_NOT_FOUND;
    }
    else {
      strerror(*piVar12);
      LVar15 = LOAD_ERROR;
      std::__cxx11::string::assign((char *)err);
    }
LAB_00105c37:
    ScopedMetric::~ScopedMetric(&metrics_h_scoped);
    return LVar15;
  }
  log_version = 0;
  __h = (__hashtable *)this;
  pFStack_400c0 = pFVar4;
  psStack_400a8 = path;
  psStack_400a0 = err;
  memset(reader.buf_,0,0x40000);
  line_start = (char *)0x0;
  line_end = (char *)0x0;
  uStack_400e0 = 0;
  uStack_400ec = 0;
  do {
    do {
      bVar2 = LineReader::ReadLine(&reader,&line_start,&line_end);
      if (!bVar2) {
        fclose(pFStack_400c0);
        if ((line_start != (char *)0x0) &&
           ((log_version < 5 ||
            ((100 < uStack_400ec && ((int)uStack_400e0 * 3 < (int)uStack_400ec)))))) {
          *(undefined1 *)&__h[1]._M_rehash_policy._M_next_resize = 1;
        }
LAB_00105c34:
        LVar15 = LOAD_SUCCESS;
        goto LAB_00105c37;
      }
      if ((log_version == 0) &&
         (__isoc99_sscanf(line_start,"# ninja log v%d\n",&log_version), log_version < 4)) {
        std::__cxx11::string::assign((char *)psStack_400a0);
        fclose(pFStack_400c0);
        unlink((psStack_400a8->_M_dataplus)._M_p);
        goto LAB_00105c34;
      }
      pcVar16 = line_start;
    } while (line_end == (char *)0x0);
    puVar5 = (undefined1 *)memchr(line_start,9,(long)line_end - (long)line_start);
    if (puVar5 != (undefined1 *)0x0) {
      *puVar5 = 0;
      iStack_400c4 = atoi(pcVar16);
      pcVar16 = puVar5 + 1;
      puVar5 = (undefined1 *)memchr(pcVar16,9,(long)line_end - (long)pcVar16);
      if (puVar5 != (undefined1 *)0x0) {
        *puVar5 = 0;
        __nptr = puVar5 + 1;
        puVar5 = (undefined1 *)memchr(__nptr,9,(long)line_end - (long)__nptr);
        if (puVar5 != (undefined1 *)0x0) {
          iVar3 = atoi(pcVar16);
          *puVar5 = 0;
          lVar6 = strtoll(__nptr,(char **)0x0,10);
          puVar5 = puVar5 + 1;
          pvVar7 = memchr(puVar5,9,(long)line_end - (long)puVar5);
          if (pvVar7 != (void *)0x0) {
            output._M_dataplus._M_p = (pointer)&output.field_2;
            iStack_400c8 = iVar3;
            lStack_400b0 = lVar6;
            std::__cxx11::string::_M_construct<char_const*>((string *)&output,puVar5);
            pcVar16 = line_end;
            kStack_40098.str_ = output._M_dataplus._M_p;
            kStack_40098.len_ = output._M_string_length;
            iVar8 = std::
                    _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(__h,&kStack_40098);
            if (iVar8.
                super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>.
                _M_cur == (__node_type *)0x0) {
              psVar9 = (string *)operator_new(0x38);
              std::__cxx11::string::string(psVar9,(string *)&output);
              kStack_40098.str_ = *(char **)psVar9;
              kStack_40098.len_ = *(size_t *)(psVar9 + 8);
              psStack_400b8 = psVar9;
              psStack_40088 = psVar9;
              pVar17 = std::
                       _Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       ::_M_emplace<std::pair<StringPiece_const,BuildLog::LogEntry*>>
                                 ((_Hashtable<StringPiece,std::pair<StringPiece_const,BuildLog::LogEntry*>,std::allocator<std::pair<StringPiece_const,BuildLog::LogEntry*>>,std::__detail::_Select1st,std::equal_to<StringPiece>,std::hash<StringPiece>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                   *)__h);
              sVar14 = pVar17._8_8_;
              uStack_400e0 = (ulong)((int)uStack_400e0 + 1);
              psVar9 = psStack_400b8;
            }
            else {
              sVar14 = extraout_RDX;
              psVar9 = *(string **)
                        ((long)iVar8.
                               super__Node_iterator_base<std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_true>
                               ._M_cur + 0x18);
            }
            this_01 = (LogEntry *)((long)pvVar7 + 1);
            *(int *)(psVar9 + 0x28) = iStack_400c4;
            *(int *)(psVar9 + 0x2c) = iStack_400c8;
            *(longlong *)(psVar9 + 0x30) = lStack_400b0;
            if (log_version < 5) {
              command.len_ = sVar14;
              command.str_ = pcVar16 + -(long)this_01;
              uVar11 = LogEntry::HashCommand(this_01,command);
              *(uint64_t *)(psVar9 + 0x20) = uVar11;
            }
            else {
              cVar1 = *pcVar16;
              *pcVar16 = '\0';
              uVar10 = strtoull((char *)this_01,(char **)0x0,0x10);
              *(ulonglong *)(psVar9 + 0x20) = uVar10;
              *pcVar16 = cVar1;
            }
            uStack_400ec = uStack_400ec + 1;
            std::__cxx11::string::~string((string *)&output);
          }
        }
      }
    }
  } while( true );
}

Assistant:

LoadStatus BuildLog::Load(const string& path, string* err) {
  METRIC_RECORD(".ninja_log load");
  FILE* file = fopen(path.c_str(), "r");
  if (!file) {
    if (errno == ENOENT)
      return LOAD_NOT_FOUND;
    *err = strerror(errno);
    return LOAD_ERROR;
  }

  int log_version = 0;
  int unique_entry_count = 0;
  int total_entry_count = 0;

  LineReader reader(file);
  char* line_start = 0;
  char* line_end = 0;
  while (reader.ReadLine(&line_start, &line_end)) {
    if (!log_version) {
      sscanf(line_start, kFileSignature, &log_version);

      if (log_version < kOldestSupportedVersion) {
        *err = ("build log version invalid, perhaps due to being too old; "
                "starting over");
        fclose(file);
        unlink(path.c_str());
        // Don't report this as a failure.  An empty build log will cause
        // us to rebuild the outputs anyway.
        return LOAD_SUCCESS;
      }
    }

    // If no newline was found in this chunk, read the next.
    if (!line_end)
      continue;

    const char kFieldSeparator = '\t';

    char* start = line_start;
    char* end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;

    int start_time = 0, end_time = 0;
    TimeStamp restat_mtime = 0;

    start_time = atoi(start);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;
    end_time = atoi(start);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    *end = 0;
    restat_mtime = strtoll(start, NULL, 10);
    start = end + 1;

    end = (char*)memchr(start, kFieldSeparator, line_end - start);
    if (!end)
      continue;
    string output = string(start, end - start);

    start = end + 1;
    end = line_end;

    LogEntry* entry;
    Entries::iterator i = entries_.find(output);
    if (i != entries_.end()) {
      entry = i->second;
    } else {
      entry = new LogEntry(output);
      entries_.insert(Entries::value_type(entry->output, entry));
      ++unique_entry_count;
    }
    ++total_entry_count;

    entry->start_time = start_time;
    entry->end_time = end_time;
    entry->mtime = restat_mtime;
    if (log_version >= 5) {
      char c = *end; *end = '\0';
      entry->command_hash = (uint64_t)strtoull(start, NULL, 16);
      *end = c;
    } else {
      entry->command_hash = LogEntry::HashCommand(StringPiece(start,
                                                              end - start));
    }
  }
  fclose(file);

  if (!line_start) {
    return LOAD_SUCCESS; // file was empty
  }

  // Decide whether it's time to rebuild the log:
  // - if we're upgrading versions
  // - if it's getting large
  int kMinCompactionEntryCount = 100;
  int kCompactionRatio = 3;
  if (log_version < kCurrentVersion) {
    needs_recompaction_ = true;
  } else if (total_entry_count > kMinCompactionEntryCount &&
             total_entry_count > unique_entry_count * kCompactionRatio) {
    needs_recompaction_ = true;
  }

  return LOAD_SUCCESS;
}